

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsCurveGeometry<2L>::set_poles
          (NurbsCurveGeometry<2L> *this,
          Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_> *poles)

{
  Index IVar1;
  Index IVar2;
  runtime_error *this_00;
  Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_> *poles_local;
  NurbsCurveGeometry<2L> *this_local;
  
  IVar1 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)poles);
  IVar2 = nb_poles(this);
  if (IVar1 != IVar2) {
    IVar1 = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)poles);
    IVar2 = CurveBase<2L>::dimension();
    if (IVar1 != IVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  Eigen::Matrix<double,-1,2,1,-1,2>::operator=
            ((Matrix<double,_1,2,1,_1,2> *)&this->m_poles,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
              *)poles);
  return;
}

Assistant:

void set_poles(Eigen::Ref<const Poles> poles)
    {
        if (poles.rows() != nb_poles() && poles.cols() != dimension()) {
            throw std::runtime_error("Invalid size");
        }

        m_poles = poles;
    }